

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool IsFilePath(ctmbstr path)

{
  char cVar1;
  char *p;
  char cVar2;
  
  cVar2 = '\0';
  while( true ) {
    cVar1 = *path;
    if ((cVar1 == '\0') || (cVar2 == '\x03')) break;
    path = path + 1;
    switch(cVar2) {
    default:
      cVar2 = cVar1 == ':';
      break;
    case '\x01':
      cVar2 = (cVar1 == '/') + '\x01';
    }
  }
  return (Bool)(cVar2 == '\0' || cVar2 == '\x03');
}

Assistant:

static Bool IsFilePath( ctmbstr path )
{
    const char *p = path;
    char c;
    typedef enum states { initial, protocol_found, slash_found, file_found } states;
    states state = initial;

    while ( ( c = *p++ ) != 0 && state != file_found )
    {
        switch ( state )
        {
            case initial:
                if ( c == ':' )
                    state = protocol_found;
                break;

            case protocol_found:
                if ( c =='/' )
                    state = slash_found;
                break;

            case slash_found:
                if ( c =='/' )
                    state = protocol_found;
                else
                    state = file_found;
                break;
                
            default:
                break;
        }
        
    }
    
    return state == file_found || state == initial;
}